

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_log_post(ma_log *pLog,ma_uint32 level,char *pMessage)

{
  void **ppvVar1;
  ulong uVar2;
  ma_result mVar3;
  
  if (pMessage == (char *)0x0 || pLog == (ma_log *)0x0) {
    mVar3 = MA_INVALID_ARGS;
  }
  else {
    ppvVar1 = &pLog->callbacks[0].pUserData;
    mVar3 = MA_SUCCESS;
    for (uVar2 = 0; uVar2 < pLog->callbackCount; uVar2 = uVar2 + 1) {
      if (((ma_log_callback *)(ppvVar1 + -1))->onLog != (ma_log_callback_proc)0x0) {
        (*((ma_log_callback *)(ppvVar1 + -1))->onLog)(*ppvVar1,level,pMessage);
      }
      ppvVar1 = ppvVar1 + 2;
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_log_post(ma_log* pLog, ma_uint32 level, const char* pMessage)
{
    if (pLog == NULL || pMessage == NULL) {
        return MA_INVALID_ARGS;
    }

    ma_log_lock(pLog);
    {
        ma_uint32 iLog;
        for (iLog = 0; iLog < pLog->callbackCount; iLog += 1) {
            if (pLog->callbacks[iLog].onLog) {
                pLog->callbacks[iLog].onLog(pLog->callbacks[iLog].pUserData, level, pMessage);
            }
        }
    }
    ma_log_unlock(pLog);

    return MA_SUCCESS;
}